

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor *
ggml_flash_attn_ext(ggml_context *ctx,ggml_tensor *q,ggml_tensor *k,ggml_tensor *v,ggml_tensor *mask
                   ,float scale,float max_bias,float logit_softcap)

{
  _Bool _Var1;
  ggml_tensor *pgVar2;
  ggml_tensor *in_RCX;
  ggml_tensor *in_RDX;
  ggml_tensor *in_RSI;
  ggml_tensor *in_R8;
  undefined4 in_XMM0_Da;
  float in_XMM1_Da;
  float params [3];
  ggml_tensor *result;
  int64_t ne [4];
  int in_stack_ffffffffffffff88;
  ggml_type in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  
  _Var1 = ggml_can_mul_mat(in_RDX,in_RSI);
  if (!_Var1) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x1135,"GGML_ASSERT(%s) failed","ggml_can_mul_mat(k, q)");
  }
  if (in_R8 != (ggml_tensor *)0x0) {
    _Var1 = ggml_is_contiguous((ggml_tensor *)0x151c59);
    if (!_Var1) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
                 0x1139,"GGML_ASSERT(%s) failed","ggml_is_contiguous(mask)");
    }
    if (in_R8->ne[2] != 1) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
                 0x113a,"GGML_ASSERT(%s) failed","mask->ne[2] == 1");
    }
    if (in_R8->ne[3] != 1) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
                 0x113b,"GGML_ASSERT(%s) failed","mask->ne[3] == 1");
    }
    if (in_R8->ne[1] < (long)(in_RSI->ne[1] + 0x3fU & 0xffffffffffffffc0)) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
                 0x113d,"GGML_ASSERT(%s) failed",
                 "mask->ne[1] >= GGML_PAD(q->ne[1], GGML_KQ_MASK_PAD) && \"the Flash-Attention kernel requires the mask to be padded to GGML_KQ_MASK_PAD and at least n_queries big\""
                );
    }
  }
  if ((0.0 < in_XMM1_Da) && (in_R8 == (ggml_tensor *)0x0)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x1142,"GGML_ASSERT(%s) failed","mask");
  }
  pgVar2 = ggml_new_tensor((ggml_context *)
                           CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                           in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88,(int64_t *)0x151dad);
  ggml_set_op_params((ggml_tensor *)CONCAT44(in_XMM0_Da,in_stack_ffffffffffffff90),
                     (void *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),0x151dea)
  ;
  pgVar2->op = GGML_OP_FLASH_ATTN_EXT;
  pgVar2->src[0] = in_RSI;
  pgVar2->src[1] = in_RDX;
  pgVar2->src[2] = in_RCX;
  pgVar2->src[3] = in_R8;
  return pgVar2;
}

Assistant:

struct ggml_tensor * ggml_flash_attn_ext(
        struct ggml_context * ctx,
        struct ggml_tensor  * q,
        struct ggml_tensor  * k,
        struct ggml_tensor  * v,
        struct ggml_tensor  * mask,
        float                 scale,
        float                 max_bias,
        float                 logit_softcap) {
    GGML_ASSERT(ggml_can_mul_mat(k, q));
    // TODO: check if vT can be multiplied by (k*qT)

    if (mask) {
        GGML_ASSERT(ggml_is_contiguous(mask));
        GGML_ASSERT(mask->ne[2] == 1);
        GGML_ASSERT(mask->ne[3] == 1);
        GGML_ASSERT(mask->ne[1] >= GGML_PAD(q->ne[1], GGML_KQ_MASK_PAD) &&
                "the Flash-Attention kernel requires the mask to be padded to GGML_KQ_MASK_PAD and at least n_queries big");
        //GGML_ASSERT(ggml_can_repeat_rows(mask, qk));
    }

    if (max_bias > 0.0f) {
        GGML_ASSERT(mask);
    }

    // permute(0, 2, 1, 3)
    int64_t ne[4] = { v->ne[0], q->ne[2], q->ne[1], q->ne[3] };
    struct ggml_tensor * result = ggml_new_tensor(ctx, GGML_TYPE_F32, 4, ne);

    float params[] = { scale, max_bias, logit_softcap };
    ggml_set_op_params(result, params, sizeof(params));

    result->op     = GGML_OP_FLASH_ATTN_EXT;
    result->src[0] = q;
    result->src[1] = k;
    result->src[2] = v;
    result->src[3] = mask;

    return result;
}